

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstraintsGroup.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::ConstraintsGroup::constraintJacobianWRTState
          (ConstraintsGroup *this,double time,VectorDynSize *state,VectorDynSize *control,
          MatrixDynSize *jacobian)

{
  MatrixDynSize *pMVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  __shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2> *p_Var7;
  element_type *peVar8;
  element_type *peVar9;
  ostream *poVar10;
  string *psVar11;
  char *pcVar12;
  size_t sVar13;
  size_t sVar14;
  DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_> *this_00
  ;
  DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_> *pDVar15
  ;
  MatrixDynSize *in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  undefined8 in_XMM0_Qa;
  uint nMissing;
  ostringstream errorMsg_5;
  ostringstream errorMsg_4;
  ostringstream errorMsg_3;
  reverse_iterator constraintIterator;
  ostringstream errorMsg_2;
  ostringstream errorMsg_1;
  ostringstream errorMsg;
  TimedConstraint_ptr loneConstraint;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>
  *in_stack_fffffffffffff358;
  undefined4 in_stack_fffffffffffff360;
  undefined4 in_stack_fffffffffffff364;
  undefined4 uVar16;
  vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
  *in_stack_fffffffffffff368;
  undefined4 in_stack_fffffffffffff370;
  undefined4 in_stack_fffffffffffff374;
  double in_stack_fffffffffffff380;
  ConstraintsGroupPimpl *in_stack_fffffffffffff388;
  unsigned_long in_stack_fffffffffffff390;
  Index in_stack_fffffffffffff398;
  ostringstream *this_01;
  Index in_stack_fffffffffffff3a0;
  string local_a20 [32];
  ostringstream local_a00 [376];
  string local_888 [32];
  ostringstream local_868 [376];
  string local_6f0 [32];
  ostringstream local_6d0 [424];
  string local_528 [32];
  ostringstream local_508 [376];
  string local_390 [32];
  ostringstream local_370 [380];
  undefined4 local_1f4;
  string local_1f0 [32];
  ostringstream local_1d0 [392];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_true>
  local_48;
  MatrixDynSize *local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  byte local_1;
  
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_18 = in_XMM0_Qa;
  bVar2 = isAnyTimeGroup((ConstraintsGroup *)in_stack_fffffffffffff388);
  if (bVar2) {
    local_48._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>
         ::begin(in_stack_fffffffffffff358);
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_false,_true>
    ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>,_false,_true>
                  *)0x3978d3);
    std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>::shared_ptr
              ((shared_ptr<iDynTree::optimalcontrol::TimedConstraint> *)
               CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),
               (shared_ptr<iDynTree::optimalcontrol::TimedConstraint> *)in_stack_fffffffffffff358);
    std::
    __shared_ptr_access<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x3978fc);
    peVar8 = std::
             __shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x397904);
    uVar3 = (*peVar8->_vptr_Constraint[4])(local_18,peVar8,local_20,local_28,local_30);
    if ((uVar3 & 1) == 0) {
      std::__cxx11::ostringstream::ostringstream(local_1d0);
      poVar10 = std::operator<<((ostream *)local_1d0,"Failed to evaluate ");
      std::
      __shared_ptr_access<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x397985);
      peVar8 = std::
               __shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x39798d);
      psVar11 = Constraint::name_abi_cxx11_(peVar8);
      poVar10 = std::operator<<(poVar10,(string *)psVar11);
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar12 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError("ConstraintsGroup","constraintJacobianWRTState",pcVar12);
      std::__cxx11::string::~string(local_1f0);
      local_1 = 0;
      local_1f4 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_1d0);
    }
    else {
      sVar13 = iDynTree::MatrixDynSize::rows();
      std::
      __shared_ptr_access<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x397ac8);
      peVar8 = std::
               __shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x397ad0);
      sVar14 = Constraint::constraintSize(peVar8);
      if (sVar13 == sVar14) {
        lVar5 = iDynTree::MatrixDynSize::cols();
        lVar6 = iDynTree::VectorDynSize::size();
        if (lVar5 == lVar6) {
          local_1 = 1;
          local_1f4 = 1;
        }
        else {
          std::__cxx11::ostringstream::ostringstream(local_508);
          poVar10 = std::operator<<((ostream *)local_508,"The state jacobian of constraint ");
          std::
          __shared_ptr_access<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
          ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x397cda);
          peVar8 = std::
                   __shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x397ce2);
          psVar11 = Constraint::name_abi_cxx11_(peVar8);
          poVar10 = std::operator<<(poVar10,(string *)psVar11);
          poVar10 = std::operator<<(poVar10,
                                    " has a number of columns different from the state size.");
          std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
          std::__cxx11::ostringstream::str();
          pcVar12 = (char *)std::__cxx11::string::c_str();
          iDynTree::reportError("ConstraintsGroup","constraintJacobianWRTState",pcVar12);
          std::__cxx11::string::~string(local_528);
          local_1 = 0;
          local_1f4 = 1;
          std::__cxx11::ostringstream::~ostringstream(local_508);
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_370);
        poVar10 = std::operator<<((ostream *)local_370,"The state jacobian of constraint ");
        std::
        __shared_ptr_access<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x397b35);
        peVar8 = std::
                 __shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x397b3d);
        psVar11 = Constraint::name_abi_cxx11_(peVar8);
        poVar10 = std::operator<<(poVar10,(string *)psVar11);
        poVar10 = std::operator<<(poVar10,
                                  " has a number of rows different from the size of the constraint."
                                 );
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        std::__cxx11::ostringstream::str();
        pcVar12 = (char *)std::__cxx11::string::c_str();
        iDynTree::reportError("ConstraintsGroup","constraintJacobianWRTState",pcVar12);
        std::__cxx11::string::~string(local_390);
        local_1 = 0;
        local_1f4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_370);
      }
    }
    std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>::~shared_ptr
              ((shared_ptr<iDynTree::optimalcontrol::TimedConstraint> *)0x397e18);
    goto LAB_0039869c;
  }
  uVar4 = iDynTree::MatrixDynSize::rows();
  if (uVar4 == *(uint *)(*in_RDI + 0x278)) {
    lVar5 = iDynTree::MatrixDynSize::cols();
    lVar6 = iDynTree::VectorDynSize::size();
    if (lVar5 != lVar6) goto LAB_00397e84;
  }
  else {
LAB_00397e84:
    pMVar1 = local_30;
    uVar3 = *(uint *)(*in_RDI + 0x278);
    iDynTree::VectorDynSize::size();
    iDynTree::MatrixDynSize::resize((ulong)pMVar1,(ulong)uVar3);
  }
  ConstraintsGroupPimpl::findActiveConstraint(in_stack_fffffffffffff388,in_stack_fffffffffffff380);
  std::
  vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>
  ::rend(in_stack_fffffffffffff368);
  bVar2 = std::operator==((reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                           *)CONCAT44(in_stack_fffffffffffff374,in_stack_fffffffffffff370),
                          (reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                           *)in_stack_fffffffffffff368);
  if (bVar2) {
    toEigen((MatrixDynSize *)in_stack_fffffffffffff388);
    Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>
    ::setZero((DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
               *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360));
    local_1 = 1;
  }
  else {
    p_Var7 = &std::
              reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
              ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                            *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360))->
              super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
    ;
    std::__shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>::get
              (p_Var7);
    peVar8 = std::
             __shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x397f76);
    p_Var7 = &std::
              reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
              ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                            *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360))->
              super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
    ;
    peVar9 = std::
             __shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>::
             get(p_Var7);
    uVar3 = (*peVar8->_vptr_Constraint[4])
                      (local_18,peVar8,local_20,local_28,&peVar9->stateJacobianBuffer);
    if ((uVar3 & 1) == 0) {
      std::__cxx11::ostringstream::ostringstream(local_6d0);
      poVar10 = std::operator<<((ostream *)local_6d0,"Failed to evaluate ");
      p_Var7 = &std::
                reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                              *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360))->
                super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
      ;
      std::__shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>::get
                (p_Var7);
      peVar8 = std::
               __shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x39805a);
      psVar11 = Constraint::name_abi_cxx11_(peVar8);
      poVar10 = std::operator<<(poVar10,(string *)psVar11);
      std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::str();
      pcVar12 = (char *)std::__cxx11::string::c_str();
      iDynTree::reportError("ConstraintsGroup","constraintJacobianWRTState",pcVar12);
      std::__cxx11::string::~string(local_6f0);
      local_1 = 0;
      local_1f4 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_6d0);
    }
    else {
      p_Var7 = &std::
                reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                              *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360))->
                super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
      ;
      std::__shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>::get
                (p_Var7);
      sVar13 = iDynTree::MatrixDynSize::rows();
      p_Var7 = &std::
                reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                              *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360))->
                super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
      ;
      std::__shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>::get
                (p_Var7);
      peVar8 = std::
               __shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x39819e);
      sVar14 = Constraint::constraintSize(peVar8);
      if (sVar13 == sVar14) {
        p_Var7 = &std::
                  reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                  ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                                *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360))->
                  super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
        ;
        std::__shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>::
        get(p_Var7);
        this_00 = (DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                   *)iDynTree::MatrixDynSize::cols();
        pDVar15 = (DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                   *)iDynTree::VectorDynSize::size();
        if (this_00 == pDVar15) {
          p_Var7 = &std::
                    reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                    ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                                  *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360))->
                    super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
          ;
          std::__shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>::
          get(p_Var7);
          peVar8 = std::
                   __shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x3984cf);
          sVar13 = Constraint::constraintSize(peVar8);
          if (sVar13 < *(uint *)(*in_RDI + 0x278)) {
            p_Var7 = &std::
                      reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                      ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                                    *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360))
                      ->
                      super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
            ;
            std::__shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
            ::get(p_Var7);
            toEigen((MatrixDynSize *)in_stack_fffffffffffff388);
            toEigen((MatrixDynSize *)in_stack_fffffffffffff388);
            p_Var7 = &std::
                      reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                      ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                                    *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360))
                      ->
                      super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
            ;
            std::__shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
            ::get(p_Var7);
            pDVar15 = (DenseBase<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                       *)iDynTree::MatrixDynSize::rows();
            iDynTree::VectorDynSize::size();
            Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>>::
            block<unsigned_long,unsigned_long>
                      (this_00,in_stack_fffffffffffff3a0,in_stack_fffffffffffff398,
                       in_stack_fffffffffffff390,(unsigned_long)in_stack_fffffffffffff388);
            uVar3 = (uint)(in_stack_fffffffffffff390 >> 0x20);
            Eigen::
            Block<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>,-1,-1,false>
            ::operator=((Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>
                         *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360),pDVar15);
            uVar16 = *(undefined4 *)(*in_RDI + 0x278);
            p_Var7 = &std::
                      reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                      ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                                    *)CONCAT44(uVar16,in_stack_fffffffffffff360))->
                      super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
            ;
            std::__shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
            ::get(p_Var7);
            peVar8 = std::
                     __shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x3985cb);
            Constraint::constraintSize(peVar8);
            toEigen((MatrixDynSize *)in_stack_fffffffffffff388);
            p_Var7 = &std::
                      reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                      ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                                    *)CONCAT44(uVar16,in_stack_fffffffffffff360))->
                      super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
            ;
            std::__shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
            ::get(p_Var7);
            iDynTree::MatrixDynSize::rows();
            iDynTree::VectorDynSize::size();
            Eigen::DenseBase<Eigen::Map<Eigen::Matrix<double,-1,-1,1,-1,-1>,0,Eigen::Stride<0,0>>>::
            block<unsigned_int,unsigned_long>
                      (this_00,in_stack_fffffffffffff3a0,in_stack_fffffffffffff398,uVar3,
                       (unsigned_long)in_stack_fffffffffffff388);
            Eigen::
            DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_-1,_-1,_false>_>
            ::setZero((DenseBase<Eigen::Block<Eigen::Map<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::Stride<0,_0>_>,__1,__1,_false>_>
                       *)CONCAT44(uVar16,in_stack_fffffffffffff360));
          }
          else {
            p_Var7 = &std::
                      reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                      ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                                    *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360))
                      ->
                      super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
            ;
            peVar9 = std::
                     __shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
                     ::get(p_Var7);
            iDynTree::MatrixDynSize::operator=(local_30,&peVar9->stateJacobianBuffer);
          }
          local_1 = 1;
        }
        else {
          this_01 = local_a00;
          std::__cxx11::ostringstream::ostringstream(this_01);
          poVar10 = std::operator<<((ostream *)this_01,"The state jacobian of constraint ");
          p_Var7 = &std::
                    reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                    ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                                  *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360))->
                    super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
          ;
          std::__shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>::
          get(p_Var7);
          peVar8 = std::
                   __shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x3983ab);
          psVar11 = Constraint::name_abi_cxx11_(peVar8);
          poVar10 = std::operator<<(poVar10,(string *)psVar11);
          poVar10 = std::operator<<(poVar10,
                                    " has a number of columns different from the state size.");
          std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
          std::__cxx11::ostringstream::str();
          pcVar12 = (char *)std::__cxx11::string::c_str();
          iDynTree::reportError("ConstraintsGroup","constraintJacobianWRTState",pcVar12);
          std::__cxx11::string::~string(local_a20);
          local_1 = 0;
          local_1f4 = 1;
          std::__cxx11::ostringstream::~ostringstream(local_a00);
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream(local_868);
        poVar10 = std::operator<<((ostream *)local_868,"The state jacobian of constraint ");
        p_Var7 = &std::
                  reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                  ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_*,_std::vector<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>,_std::allocator<std::shared_ptr<iDynTree::optimalcontrol::TimedConstraint>_>_>_>_>
                                *)CONCAT44(in_stack_fffffffffffff364,in_stack_fffffffffffff360))->
                  super___shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>
        ;
        std::__shared_ptr<iDynTree::optimalcontrol::TimedConstraint,_(__gnu_cxx::_Lock_policy)2>::
        get(p_Var7);
        peVar8 = std::
                 __shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::Constraint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x39820d);
        psVar11 = Constraint::name_abi_cxx11_(peVar8);
        poVar10 = std::operator<<(poVar10,(string *)psVar11);
        poVar10 = std::operator<<(poVar10,
                                  " has a number of rows different from the size of the constraint."
                                 );
        std::ostream::operator<<(poVar10,std::endl<char,std::char_traits<char>>);
        std::__cxx11::ostringstream::str();
        pcVar12 = (char *)std::__cxx11::string::c_str();
        iDynTree::reportError("ConstraintsGroup","constraintJacobianWRTState",pcVar12);
        std::__cxx11::string::~string(local_888);
        local_1 = 0;
        local_1f4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_868);
      }
    }
  }
LAB_0039869c:
  return (bool)(local_1 & 1);
}

Assistant:

bool ConstraintsGroup::constraintJacobianWRTState(double time, const VectorDynSize &state, const VectorDynSize &control, MatrixDynSize &jacobian)
        {
            if (isAnyTimeGroup()) {
                TimedConstraint_ptr loneConstraint = m_pimpl->group.begin()->second;
                if (!(loneConstraint->constraint->constraintJacobianWRTState(time, state, control, jacobian))) {
                    std::ostringstream errorMsg;
                    errorMsg << "Failed to evaluate "<< loneConstraint->constraint->name() << std::endl;
                    reportError("ConstraintsGroup", "constraintJacobianWRTState", errorMsg.str().c_str());
                    return false;
                }

                if (jacobian.rows() != loneConstraint->constraint->constraintSize()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The state jacobian of constraint "<< loneConstraint->constraint->name() << " has a number of rows different from the size of the constraint." << std::endl;
                    reportError("ConstraintsGroup", "constraintJacobianWRTState", errorMsg.str().c_str());
                    return false;
                }

                if (jacobian.cols() != state.size()) {
                    std::ostringstream errorMsg;
                    errorMsg << "The state jacobian of constraint "<< loneConstraint->constraint->name() << " has a number of columns different from the state size." << std::endl;
                    reportError("ConstraintsGroup", "constraintJacobianWRTState", errorMsg.str().c_str());
                    return false;
                }

                return true;
            }

            if ((jacobian.rows() != m_pimpl->maxConstraintSize)||(jacobian.cols() != state.size())) {
                jacobian.resize(m_pimpl->maxConstraintSize, state.size());
            }

            std::vector< TimedConstraint_ptr >::reverse_iterator constraintIterator = m_pimpl->findActiveConstraint(time);
            if (constraintIterator == m_pimpl->orderedIntervals.rend()){ //no active constraint
                toEigen(jacobian).setZero();
                return true;
            }

            if (!(constraintIterator->get()->constraint->constraintJacobianWRTState(time, state, control,
                                                                                   constraintIterator->get()->stateJacobianBuffer))) {
                std::ostringstream errorMsg;
                errorMsg << "Failed to evaluate "<< constraintIterator->get()->constraint->name() << std::endl;
                reportError("ConstraintsGroup", "constraintJacobianWRTState", errorMsg.str().c_str());
                return false;
            }

            if (constraintIterator->get()->stateJacobianBuffer.rows() != constraintIterator->get()->constraint->constraintSize()) {
                std::ostringstream errorMsg;
                errorMsg << "The state jacobian of constraint "<< constraintIterator->get()->constraint->name() << " has a number of rows different from the size of the constraint." << std::endl;
                reportError("ConstraintsGroup", "constraintJacobianWRTState", errorMsg.str().c_str());
                return false;
            }

            if (constraintIterator->get()->stateJacobianBuffer.cols() != state.size()) {
                std::ostringstream errorMsg;
                errorMsg << "The state jacobian of constraint "<< constraintIterator->get()->constraint->name() << " has a number of columns different from the state size." << std::endl;
                reportError("ConstraintsGroup", "constraintJacobianWRTState", errorMsg.str().c_str());
                return false;
            }

            if (constraintIterator->get()->constraint->constraintSize() < m_pimpl->maxConstraintSize) {
                toEigen(jacobian).block(0, 0, constraintIterator->get()->stateJacobianBuffer.rows(), state.size()) =
                        toEigen(constraintIterator->get()->stateJacobianBuffer);
                unsigned int nMissing = m_pimpl->maxConstraintSize - static_cast<unsigned int>(constraintIterator->get()->constraint->constraintSize());
                toEigen(jacobian).block(constraintIterator->get()->stateJacobianBuffer.rows(), 0, nMissing, state.size()).setZero();
            } else {
                jacobian = constraintIterator->get()->stateJacobianBuffer;
            }

            return true;
        }